

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void __thiscall
rtosc::MergePorts::MergePorts(MergePorts *this,initializer_list<const_rtosc::Ports_*> c)

{
  initializer_list<rtosc::Port> l;
  bool bVar1;
  int iVar2;
  const_iterator ppPVar3;
  reference pPVar4;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *in_RDI;
  Port *pp;
  iterator __end3;
  iterator __begin3;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range3;
  bool already_there;
  Port *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range2;
  Ports *to_clone;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_rtosc::Ports_*> *__range1;
  initializer_list<const_rtosc::Ports_*> *in_stack_ffffffffffffff60;
  value_type *in_stack_ffffffffffffff68;
  reference in_stack_ffffffffffffff70;
  __normal_iterator<rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  local_80 [2];
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  Ports *in_stack_ffffffffffffffa0;
  __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
  in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb0;
  const_iterator local_38;
  initializer_list<rtosc::Port> local_28;
  initializer_list<const_rtosc::Ports_*> local_10;
  
  std::initializer_list<rtosc::Port>::initializer_list(&local_28);
  l._M_len = in_stack_ffffffffffffffb0;
  l._M_array = in_stack_ffffffffffffffa8._M_current;
  Ports::Ports(in_stack_ffffffffffffffa0,l);
  local_38 = std::initializer_list<const_rtosc::Ports_*>::begin(&local_10);
  ppPVar3 = std::initializer_list<const_rtosc::Ports_*>::end(in_stack_ffffffffffffff60);
  for (; local_38 != ppPVar3; local_38 = local_38 + 1) {
    std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::begin(in_RDI);
    std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::end(in_RDI);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                          *)in_stack_ffffffffffffff60,
                         (__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                          *)in_RDI);
      if (!bVar1) break;
      pPVar4 = __gnu_cxx::
               __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
               ::operator*((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                            *)&stack0xffffffffffffffa8);
      in_stack_ffffffffffffff97 = 0;
      local_80[0]._M_current =
           (Port *)std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::begin(in_RDI);
      std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::end(in_RDI);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                            *)in_stack_ffffffffffffff60,
                           (__normal_iterator<rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                            *)in_RDI);
        if (!bVar1) break;
        in_stack_ffffffffffffff70 =
             __gnu_cxx::
             __normal_iterator<rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
             ::operator*(local_80);
        iVar2 = strcmp(in_stack_ffffffffffffff70->name,pPVar4->name);
        if (iVar2 == 0) {
          in_stack_ffffffffffffff97 = 1;
        }
        __gnu_cxx::
        __normal_iterator<rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>::
        operator++(local_80);
      }
      if ((in_stack_ffffffffffffff97 & 1) == 0) {
        std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::push_back
                  ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff68);
      }
      __gnu_cxx::
      __normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
      ::operator++((__normal_iterator<const_rtosc::Port_*,_std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>_>
                    *)&stack0xffffffffffffffa8);
    }
  }
  Ports::refreshMagic((Ports *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  return;
}

Assistant:

MergePorts::MergePorts(std::initializer_list<const rtosc::Ports*> c)
    :Ports({})
{
    //XXX TODO remove duplicates in some sane and documented way
    //e.g. repeated ports override and remove older ones
    for(auto *to_clone:c) {
        assert(to_clone);
        for(auto &p:to_clone->ports) {
            bool already_there = false;
            for(auto &pp:ports)
                if(!strcmp(pp.name, p.name))
                    already_there = true;

            if(!already_there)
                ports.push_back(p);
        }
    }

    refreshMagic();
}